

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

bool __thiscall ecjacobian::calcy(ecjacobian *this,bool ybit)

{
  char extraout_AL;
  bool bVar1;
  gfield *pgVar2;
  gfield *this_00;
  bigint<13> *y;
  double __x;
  gfield tmp;
  gfield y2;
  gfield gStack_68;
  gfield local_48;
  
  pgVar2 = gfield::square<13>(&local_48,(bigint<13> *)this);
  pgVar2 = gfield::mul<13>(pgVar2,(bigint<13> *)this);
  this_00 = gfield::add<13,13>(&gStack_68,(bigint<13> *)this,(bigint<13> *)this);
  y = &gfield::add<13>(this_00,(bigint<13> *)this)->super_gfint;
  pgVar2 = gfield::sub<13>(pgVar2,y);
  gfield::add<13>(pgVar2,&B.super_gfint);
  pgVar2 = &this->y;
  gfield::sqrt(pgVar2,__x);
  bVar1 = (bool)extraout_AL;
  if (extraout_AL == '\0') {
    (pgVar2->super_gfint).len = 0;
  }
  else {
    if ((pgVar2->super_gfint).len < 1) {
      if (!ybit) {
        return bVar1;
      }
    }
    else if ((bool)((byte)(this->y).super_gfint.digits[0] & 1) == ybit) {
      return bVar1;
    }
    gfield::neg(pgVar2);
  }
  return bVar1;
}

Assistant:

bool calcy(bool ybit)
    {
        gfield y2, tmp;
        y2.square(x).mul(x).sub(tmp.add(x, x).add(x)).add(B);
        if(!y.sqrt(y2)) { y.zero(); return false; }
        if(y.hasbit(0) != ybit) y.neg();
        return true;
    }